

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fadst8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  longlong lVar50;
  longlong lVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  __m256i x7 [8];
  __m256i x6 [8];
  __m256i x5 [8];
  __m256i x4 [8];
  __m256i x3 [8];
  __m256i x2 [8];
  __m256i x1 [8];
  __m256i x [8];
  __m256i cospi_arr [20];
  __m128i cospi_p06_m58;
  __m128i cospi_p58_p06;
  __m128i cospi_p14_m50;
  __m128i cospi_p50_p14;
  __m128i cospi_p22_m42;
  __m128i cospi_p42_p22;
  __m128i cospi_p30_m34;
  __m128i cospi_p34_p30;
  __m128i cospi_p38_m26;
  __m128i cospi_p26_p38;
  __m128i cospi_p46_m18;
  __m128i cospi_p18_p46;
  __m128i cospi_p54_m10;
  __m128i cospi_p10_p54;
  __m128i cospi_p62_m02;
  __m128i cospi_p02_p62;
  __m128i cospi_m24_p40;
  __m128i cospi_m56_p08;
  __m128i cospi_p24_m40;
  __m128i cospi_p40_p24;
  __m128i cospi_p56_m08;
  __m128i cospi_p08_p56;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  __m128i temp0;
  __m256i in1;
  __m256i in0;
  __m256i __rounding_256;
  __m256i __zero;
  int32_t *cospi;
  int8_t *in_stack_ffffffffffffe420;
  __m128i *in_stack_ffffffffffffe608;
  __m128i *in_stack_ffffffffffffe610;
  __m256i *in_stack_ffffffffffffe618;
  __m256i *in_stack_ffffffffffffe620;
  __m256i *in_stack_ffffffffffffe628;
  __m256i *in_stack_ffffffffffffe630;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  __m256i *local_1900;
  __m256i *palStack_18f8;
  __m256i *palStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  __m128i *palStack_18d8;
  __m128i *palStack_18d0;
  __m256i *palStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  longlong local_ee0;
  longlong lStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  longlong local_e60;
  longlong lStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  int32_t *local_e10;
  char local_e01;
  long local_e00;
  undefined1 (*local_df8) [16];
  uint local_dec;
  uint local_de8;
  uint local_de4;
  uint local_de0;
  uint local_ddc;
  uint local_dd8;
  uint local_dd4;
  uint local_dd0;
  uint local_dcc;
  uint local_dc8;
  uint local_dc4;
  uint local_dc0;
  uint local_dbc;
  uint local_db8;
  uint local_db4;
  uint local_db0;
  uint local_dac;
  uint local_da8;
  uint local_da4;
  uint local_da0;
  uint local_d9c;
  uint local_d98;
  uint local_d94;
  uint local_d90;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  undefined1 local_d80 [16];
  uint local_d70;
  uint local_d6c;
  uint local_d68;
  uint local_d64;
  undefined1 local_d60 [16];
  uint local_d50;
  uint local_d4c;
  uint local_d48;
  uint local_d44;
  undefined1 local_d40 [16];
  uint local_d30;
  uint local_d2c;
  uint local_d28;
  uint local_d24;
  undefined1 local_d20 [16];
  uint local_d10;
  uint local_d0c;
  uint local_d08;
  uint local_d04;
  undefined1 local_d00 [16];
  uint local_cf0;
  uint local_cec;
  uint local_ce8;
  uint local_ce4;
  undefined1 local_ce0 [16];
  uint local_cd0;
  uint local_ccc;
  uint local_cc8;
  uint local_cc4;
  undefined1 local_cc0 [16];
  uint local_cb0;
  uint local_cac;
  uint local_ca8;
  uint local_ca4;
  undefined1 local_ca0 [16];
  uint local_c90;
  uint local_c8c;
  uint local_c88;
  uint local_c84;
  undefined1 local_c80 [16];
  uint local_c70;
  uint local_c6c;
  uint local_c68;
  uint local_c64;
  undefined1 local_c60 [16];
  uint local_c50;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  undefined1 local_c40 [16];
  uint local_c30;
  uint local_c2c;
  uint local_c28;
  uint local_c24;
  undefined1 local_c20 [16];
  uint local_c10;
  uint local_c0c;
  uint local_c08;
  uint local_c04;
  undefined1 local_c00 [16];
  uint local_bf0;
  uint local_bec;
  uint local_be8;
  uint local_be4;
  undefined1 local_be0 [16];
  uint local_bd0;
  uint local_bcc;
  uint local_bc8;
  uint local_bc4;
  undefined1 local_bc0 [16];
  uint local_bb0;
  uint local_bac;
  uint local_ba8;
  uint local_ba4;
  undefined1 local_ba0 [16];
  uint local_b90;
  uint local_b8c;
  uint local_b88;
  uint local_b84;
  undefined1 local_b80 [16];
  uint local_b70;
  uint local_b6c;
  uint local_b68;
  uint local_b64;
  undefined1 local_b60 [16];
  uint local_b50;
  uint local_b4c;
  uint local_b48;
  uint local_b44;
  undefined1 local_b40 [16];
  uint local_b30;
  uint local_b2c;
  uint local_b28;
  uint local_b24;
  undefined1 local_b20 [16];
  uint local_b10;
  uint local_b0c;
  uint local_b08;
  uint local_b04;
  undefined1 local_b00 [16];
  uint local_af0;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  undefined1 local_ae0 [16];
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  undefined1 local_ac0 [16];
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  undefined1 local_aa0 [16];
  uint local_a90;
  uint local_a8c;
  uint local_a88;
  uint local_a84;
  undefined1 local_a80 [16];
  uint local_a70;
  uint local_a6c;
  uint local_a68;
  uint local_a64;
  undefined1 local_a60 [16];
  uint local_a50;
  uint local_a4c;
  uint local_a48;
  uint local_a44;
  undefined1 local_a40 [16];
  uint local_a30;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  longlong lStack_790;
  longlong lStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  __m256i *local_740;
  __m256i *palStack_738;
  __m256i *palStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  longlong lStack_710;
  longlong lStack_708;
  undefined8 local_700;
  __m128i *palStack_6f8;
  __m128i *palStack_6f0;
  __m256i *palStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  longlong lStack_690;
  longlong lStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  longlong lStack_610;
  longlong lStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  longlong lStack_590;
  longlong lStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  longlong lStack_510;
  longlong lStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  uint local_484;
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  uint local_460;
  uint local_45c;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  uint local_444;
  undefined8 local_440;
  undefined8 uStack_438;
  longlong lStack_430;
  longlong lStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  __m256i *local_3e0;
  __m256i *palStack_3d8;
  __m256i *palStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  undefined8 local_3a0;
  __m128i *palStack_398;
  __m128i *palStack_390;
  __m256i *palStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  longlong lStack_330;
  longlong lStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  longlong lStack_230;
  longlong lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  local_e01 = in_DL;
  local_e00 = in_RSI;
  local_df8 = in_RDI;
  local_e10 = ::cospi_arr((int)in_DL);
  local_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  local_e40 = 0;
  uStack_e38 = 0;
  uStack_e30 = 0;
  uStack_e28 = 0;
  local_484 = 1 << (local_e01 - 1U & 0x1f);
  auVar4 = vpinsrd_avx(ZEXT416(local_484),local_484,1);
  auVar4 = vpinsrd_avx(auVar4,local_484,2);
  local_480 = vpinsrd_avx(auVar4,local_484,3);
  auVar4 = vpinsrd_avx(ZEXT416(local_484),local_484,1);
  auVar4 = vpinsrd_avx(auVar4,local_484,2);
  auStack_470 = vpinsrd_avx(auVar4,local_484,3);
  local_e60 = local_480._0_8_;
  lStack_e58 = local_480._8_8_;
  uStack_e50 = auStack_470._0_8_;
  uStack_e48 = auStack_470._8_8_;
  local_d84 = CONCAT22((short)local_e10[0x20],(short)local_e10[0x20]);
  auVar4 = vpinsrd_avx(ZEXT416(local_d84),local_d84,1);
  auVar4 = vpinsrd_avx(auVar4,local_d84,2);
  local_d80 = vpinsrd_avx(auVar4,local_d84,3);
  local_d88 = (local_e10[0x20] & 0xffffU) + local_e10[0x20] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_d88),local_d88,1);
  auVar4 = vpinsrd_avx(auVar4,local_d88,2);
  local_d60 = vpinsrd_avx(auVar4,local_d88,3);
  local_d8c = (uint)*(ushort *)(local_e10 + 0x10) | local_e10[0x30] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_d8c),local_d8c,1);
  auVar4 = vpinsrd_avx(auVar4,local_d8c,2);
  local_d40 = vpinsrd_avx(auVar4,local_d8c,3);
  local_d90 = (uint)*(ushort *)(local_e10 + 0x30) + local_e10[0x10] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_d90),local_d90,1);
  auVar4 = vpinsrd_avx(auVar4,local_d90,2);
  local_d20 = vpinsrd_avx(auVar4,local_d90,3);
  local_d94 = -local_e10[0x30] & 0xffffU | local_e10[0x10] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_d94),local_d94,1);
  auVar4 = vpinsrd_avx(auVar4,local_d94,2);
  local_d00 = vpinsrd_avx(auVar4,local_d94,3);
  local_d98 = (uint)*(ushort *)(local_e10 + 8) | local_e10[0x38] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_d98),local_d98,1);
  auVar4 = vpinsrd_avx(auVar4,local_d98,2);
  local_ce0 = vpinsrd_avx(auVar4,local_d98,3);
  local_d9c = (uint)*(ushort *)(local_e10 + 0x38) + local_e10[8] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_d9c),local_d9c,1);
  auVar4 = vpinsrd_avx(auVar4,local_d9c,2);
  local_cc0 = vpinsrd_avx(auVar4,local_d9c,3);
  local_da0 = (uint)*(ushort *)(local_e10 + 0x28) | local_e10[0x18] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_da0),local_da0,1);
  auVar4 = vpinsrd_avx(auVar4,local_da0,2);
  local_ca0 = vpinsrd_avx(auVar4,local_da0,3);
  local_da4 = (uint)*(ushort *)(local_e10 + 0x18) + local_e10[0x28] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_da4),local_da4,1);
  auVar4 = vpinsrd_avx(auVar4,local_da4,2);
  local_c80 = vpinsrd_avx(auVar4,local_da4,3);
  local_da8 = -local_e10[0x38] & 0xffffU | local_e10[8] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_da8),local_da8,1);
  auVar4 = vpinsrd_avx(auVar4,local_da8,2);
  local_c60 = vpinsrd_avx(auVar4,local_da8,3);
  local_dac = -local_e10[0x18] & 0xffffU | local_e10[0x28] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_dac),local_dac,1);
  auVar4 = vpinsrd_avx(auVar4,local_dac,2);
  local_c40 = vpinsrd_avx(auVar4,local_dac,3);
  local_db0 = (uint)*(ushort *)(local_e10 + 2) | local_e10[0x3e] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_db0),local_db0,1);
  auVar4 = vpinsrd_avx(auVar4,local_db0,2);
  local_c20 = vpinsrd_avx(auVar4,local_db0,3);
  local_db4 = (uint)*(ushort *)(local_e10 + 0x3e) + local_e10[2] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_db4),local_db4,1);
  auVar4 = vpinsrd_avx(auVar4,local_db4,2);
  local_c00 = vpinsrd_avx(auVar4,local_db4,3);
  local_db8 = (uint)*(ushort *)(local_e10 + 10) | local_e10[0x36] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_db8),local_db8,1);
  auVar4 = vpinsrd_avx(auVar4,local_db8,2);
  local_be0 = vpinsrd_avx(auVar4,local_db8,3);
  local_dbc = (uint)*(ushort *)(local_e10 + 0x36) + local_e10[10] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_dbc),local_dbc,1);
  auVar4 = vpinsrd_avx(auVar4,local_dbc,2);
  local_bc0 = vpinsrd_avx(auVar4,local_dbc,3);
  local_dc0 = (uint)*(ushort *)(local_e10 + 0x12) | local_e10[0x2e] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_dc0),local_dc0,1);
  auVar4 = vpinsrd_avx(auVar4,local_dc0,2);
  local_ba0 = vpinsrd_avx(auVar4,local_dc0,3);
  local_dc4 = (uint)*(ushort *)(local_e10 + 0x2e) + local_e10[0x12] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_dc4),local_dc4,1);
  auVar4 = vpinsrd_avx(auVar4,local_dc4,2);
  local_b80 = vpinsrd_avx(auVar4,local_dc4,3);
  local_dc8 = (uint)*(ushort *)(local_e10 + 0x1a) | local_e10[0x26] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_dc8),local_dc8,1);
  auVar4 = vpinsrd_avx(auVar4,local_dc8,2);
  local_b60 = vpinsrd_avx(auVar4,local_dc8,3);
  local_dcc = (uint)*(ushort *)(local_e10 + 0x26) + local_e10[0x1a] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_dcc),local_dcc,1);
  auVar4 = vpinsrd_avx(auVar4,local_dcc,2);
  local_b40 = vpinsrd_avx(auVar4,local_dcc,3);
  local_dd0 = (uint)*(ushort *)(local_e10 + 0x22) | local_e10[0x1e] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_dd0),local_dd0,1);
  auVar4 = vpinsrd_avx(auVar4,local_dd0,2);
  local_b20 = vpinsrd_avx(auVar4,local_dd0,3);
  local_dd4 = (uint)*(ushort *)(local_e10 + 0x1e) + local_e10[0x22] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_dd4),local_dd4,1);
  auVar4 = vpinsrd_avx(auVar4,local_dd4,2);
  local_b00 = vpinsrd_avx(auVar4,local_dd4,3);
  local_dd8 = (uint)*(ushort *)(local_e10 + 0x2a) | local_e10[0x16] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_dd8),local_dd8,1);
  auVar4 = vpinsrd_avx(auVar4,local_dd8,2);
  local_ae0 = vpinsrd_avx(auVar4,local_dd8,3);
  local_ddc = (uint)*(ushort *)(local_e10 + 0x16) + local_e10[0x2a] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_ddc),local_ddc,1);
  auVar4 = vpinsrd_avx(auVar4,local_ddc,2);
  local_ac0 = vpinsrd_avx(auVar4,local_ddc,3);
  local_de0 = (uint)*(ushort *)(local_e10 + 0x32) | local_e10[0xe] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_de0),local_de0,1);
  auVar4 = vpinsrd_avx(auVar4,local_de0,2);
  local_aa0 = vpinsrd_avx(auVar4,local_de0,3);
  local_de4 = (uint)*(ushort *)(local_e10 + 0xe) + local_e10[0x32] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_de4),local_de4,1);
  auVar4 = vpinsrd_avx(auVar4,local_de4,2);
  local_a80 = vpinsrd_avx(auVar4,local_de4,3);
  local_de8 = (uint)*(ushort *)(local_e10 + 0x3a) | local_e10[6] << 0x10;
  auVar4 = vpinsrd_avx(ZEXT416(local_de8),local_de8,1);
  auVar4 = vpinsrd_avx(auVar4,local_de8,2);
  local_a60 = vpinsrd_avx(auVar4,local_de8,3);
  local_dec = (uint)*(ushort *)(local_e10 + 6) + local_e10[0x3a] * -0x10000;
  auVar4 = vpinsrd_avx(ZEXT416(local_dec),local_dec,1);
  auVar4 = vpinsrd_avx(auVar4,local_dec,2);
  local_a40 = vpinsrd_avx(auVar4,local_dec,3);
  local_7b0 = local_d80._0_8_;
  uStack_7a8 = local_d80._8_8_;
  local_7c0 = local_d60._0_8_;
  uStack_7b8 = local_d60._8_8_;
  local_7d0 = local_d80._0_8_;
  uStack_7c8 = local_d80._8_8_;
  local_7e0 = local_d60._0_8_;
  uStack_7d8 = local_d60._8_8_;
  local_7f0 = local_d40._0_8_;
  uStack_7e8 = local_d40._8_8_;
  local_800 = local_d20._0_8_;
  uStack_7f8 = local_d20._8_8_;
  local_810 = local_d40._0_8_;
  uStack_808 = local_d40._8_8_;
  local_820 = local_d20._0_8_;
  uStack_818 = local_d20._8_8_;
  local_830 = local_ce0._0_8_;
  uStack_828 = local_ce0._8_8_;
  local_840 = local_cc0._0_8_;
  uStack_838 = local_cc0._8_8_;
  local_850 = local_c60._0_8_;
  uStack_848 = local_c60._8_8_;
  local_860 = local_ce0._0_8_;
  uStack_858 = local_ce0._8_8_;
  local_870 = local_c20._0_8_;
  uStack_868 = local_c20._8_8_;
  local_880 = local_c00._0_8_;
  uStack_878 = local_c00._8_8_;
  local_890 = local_ba0._0_8_;
  uStack_888 = local_ba0._8_8_;
  local_8a0 = local_b80._0_8_;
  uStack_898 = local_b80._8_8_;
  local_8b0 = local_b20._0_8_;
  uStack_8a8 = local_b20._8_8_;
  local_8c0 = local_b00._0_8_;
  uStack_8b8 = local_b00._8_8_;
  local_8d0 = local_aa0._0_8_;
  uStack_8c8 = local_aa0._8_8_;
  local_8e0 = local_a80._0_8_;
  uStack_8d8 = local_a80._8_8_;
  local_8f0 = *(undefined8 *)*local_df8;
  uStack_8e8 = *(undefined8 *)(*local_df8 + 8);
  pauVar1 = local_df8 + 2;
  local_900 = *(undefined8 *)*pauVar1;
  uStack_8f8 = *(undefined8 *)(local_df8[2] + 8);
  auVar4 = *pauVar1;
  uVar13 = *(undefined8 *)local_df8[6];
  uVar14 = *(undefined8 *)(local_df8[6] + 8);
  pauVar2 = local_df8 + 8;
  local_910 = *(undefined8 *)*pauVar2;
  uStack_908 = *(undefined8 *)(local_df8[8] + 8);
  pauVar3 = local_df8 + 10;
  local_920 = *(undefined8 *)*pauVar3;
  uStack_918 = *(undefined8 *)(local_df8[10] + 8);
  auVar49 = *pauVar3;
  uVar15 = *(undefined8 *)local_df8[0xe];
  uVar16 = *(undefined8 *)(local_df8[0xe] + 8);
  local_930 = *(undefined8 *)local_df8[1];
  uStack_928 = *(undefined8 *)(local_df8[1] + 8);
  uStack_f0 = *(undefined8 *)local_df8[9];
  uStack_e8 = *(undefined8 *)(local_df8[9] + 8);
  local_940 = *(undefined8 *)local_df8[3];
  uStack_938 = *(undefined8 *)(local_df8[3] + 8);
  uStack_b0 = *(undefined8 *)local_df8[0xb];
  uStack_a8 = *(undefined8 *)(local_df8[0xb] + 8);
  local_950 = *(undefined8 *)local_df8[5];
  uStack_948 = *(undefined8 *)(local_df8[5] + 8);
  uStack_130 = *(undefined8 *)local_df8[0xd];
  uStack_128 = *(undefined8 *)(local_df8[0xd] + 8);
  local_960 = *(undefined8 *)local_df8[7];
  uStack_958 = *(undefined8 *)(local_df8[7] + 8);
  uStack_70 = *(undefined8 *)local_df8[0xf];
  uStack_68 = *(undefined8 *)(local_df8[0xf] + 8);
  local_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  auVar48._16_8_ = uStack_70;
  auVar48._0_16_ = local_df8[7];
  auVar48._24_8_ = uStack_68;
  auVar5 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),auVar48);
  local_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  auVar47._16_8_ = uStack_b0;
  auVar47._0_16_ = local_df8[3];
  auVar47._24_8_ = uStack_a8;
  auVar6 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),auVar47);
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  auVar46._16_8_ = uStack_f0;
  auVar46._0_16_ = local_df8[1];
  auVar46._24_8_ = uStack_e8;
  auVar7 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),auVar46);
  local_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  auVar45._16_8_ = uStack_130;
  auVar45._0_16_ = local_df8[5];
  auVar45._24_8_ = uStack_128;
  auVar8 = vpsubsw_avx2(ZEXT1632(ZEXT816(0)),auVar45);
  auVar9._16_8_ = *(undefined8 *)local_df8[4];
  auVar9._0_16_ = *local_df8;
  auVar9._24_8_ = *(undefined8 *)(local_df8[4] + 8);
  auVar9 = vpblendd_avx2(auVar9,auVar5,0xf0);
  auVar10._16_8_ = *(undefined8 *)local_df8[0xc];
  auVar10._0_16_ = *pauVar2;
  auVar10._24_8_ = *(undefined8 *)(local_df8[0xc] + 8);
  auVar10 = vpblendd_avx2(auVar6,auVar10,0xf0);
  auVar11._16_8_ = uVar15;
  auVar11._0_16_ = *pauVar3;
  auVar11._24_8_ = uVar16;
  auVar11 = vpblendd_avx2(auVar7,auVar11,0xf0);
  auVar12._16_8_ = uVar13;
  auVar12._0_16_ = *pauVar1;
  auVar12._24_8_ = uVar14;
  auVar12 = vpblendd_avx2(auVar12,auVar8,0xf0);
  auVar17._16_8_ = *(undefined8 *)local_df8[4];
  auVar17._0_16_ = *local_df8;
  auVar17._24_8_ = *(undefined8 *)(local_df8[4] + 8);
  local_e80 = vpblendd_avx2(auVar5,auVar17,0xf0);
  auVar5._16_8_ = *(undefined8 *)local_df8[0xc];
  auVar5._0_16_ = *pauVar2;
  auVar5._24_8_ = *(undefined8 *)(local_df8[0xc] + 8);
  local_ea0 = vpblendd_avx2(auVar5,auVar6,0xf0);
  local_d70 = local_d84;
  local_d6c = local_d84;
  local_d68 = local_d84;
  local_d64 = local_d84;
  local_d50 = local_d88;
  local_d4c = local_d88;
  local_d48 = local_d88;
  local_d44 = local_d88;
  local_d30 = local_d8c;
  local_d2c = local_d8c;
  local_d28 = local_d8c;
  local_d24 = local_d8c;
  local_d10 = local_d90;
  local_d0c = local_d90;
  local_d08 = local_d90;
  local_d04 = local_d90;
  local_cf0 = local_d94;
  local_cec = local_d94;
  local_ce8 = local_d94;
  local_ce4 = local_d94;
  local_cd0 = local_d98;
  local_ccc = local_d98;
  local_cc8 = local_d98;
  local_cc4 = local_d98;
  local_cb0 = local_d9c;
  local_cac = local_d9c;
  local_ca8 = local_d9c;
  local_ca4 = local_d9c;
  local_c90 = local_da0;
  local_c8c = local_da0;
  local_c88 = local_da0;
  local_c84 = local_da0;
  local_c70 = local_da4;
  local_c6c = local_da4;
  local_c68 = local_da4;
  local_c64 = local_da4;
  local_c50 = local_da8;
  local_c4c = local_da8;
  local_c48 = local_da8;
  local_c44 = local_da8;
  local_c30 = local_dac;
  local_c2c = local_dac;
  local_c28 = local_dac;
  local_c24 = local_dac;
  local_c10 = local_db0;
  local_c0c = local_db0;
  local_c08 = local_db0;
  local_c04 = local_db0;
  local_bf0 = local_db4;
  local_bec = local_db4;
  local_be8 = local_db4;
  local_be4 = local_db4;
  local_bd0 = local_db8;
  local_bcc = local_db8;
  local_bc8 = local_db8;
  local_bc4 = local_db8;
  local_bb0 = local_dbc;
  local_bac = local_dbc;
  local_ba8 = local_dbc;
  local_ba4 = local_dbc;
  local_b90 = local_dc0;
  local_b8c = local_dc0;
  local_b88 = local_dc0;
  local_b84 = local_dc0;
  local_b70 = local_dc4;
  local_b6c = local_dc4;
  local_b68 = local_dc4;
  local_b64 = local_dc4;
  local_b50 = local_dc8;
  local_b4c = local_dc8;
  local_b48 = local_dc8;
  local_b44 = local_dc8;
  local_b30 = local_dcc;
  local_b2c = local_dcc;
  local_b28 = local_dcc;
  local_b24 = local_dcc;
  local_b10 = local_dd0;
  local_b0c = local_dd0;
  local_b08 = local_dd0;
  local_b04 = local_dd0;
  local_af0 = local_dd4;
  local_aec = local_dd4;
  local_ae8 = local_dd4;
  local_ae4 = local_dd4;
  local_ad0 = local_dd8;
  local_acc = local_dd8;
  local_ac8 = local_dd8;
  local_ac4 = local_dd8;
  local_ab0 = local_ddc;
  local_aac = local_ddc;
  local_aa8 = local_ddc;
  local_aa4 = local_ddc;
  local_a90 = local_de0;
  local_a8c = local_de0;
  local_a88 = local_de0;
  local_a84 = local_de0;
  local_a70 = local_de4;
  local_a6c = local_de4;
  local_a68 = local_de4;
  local_a64 = local_de4;
  local_a50 = local_de8;
  local_a4c = local_de8;
  local_a48 = local_de8;
  local_a44 = local_de8;
  local_a30 = local_dec;
  local_a2c = local_dec;
  local_a28 = local_dec;
  local_a24 = local_dec;
  local_460 = local_484;
  local_45c = local_484;
  local_458 = local_484;
  local_454 = local_484;
  local_450 = local_484;
  local_44c = local_484;
  local_448 = local_484;
  local_444 = local_484;
  local_140 = local_950;
  uStack_138 = uStack_948;
  local_100 = local_930;
  uStack_f8 = uStack_928;
  local_c0 = local_940;
  uStack_b8 = uStack_938;
  local_80 = local_960;
  uStack_78 = uStack_958;
  btf_16_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,
              in_stack_ffffffffffffe618,in_stack_ffffffffffffe610,in_stack_ffffffffffffe608,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  uVar57 = uStack_ea8;
  uVar56 = local_eb0;
  uVar55 = uStack_eb8;
  uVar54 = local_ec0;
  uVar53 = uStack_ec8;
  uVar52 = local_ed0;
  lVar51 = lStack_ed8;
  lVar50 = local_ee0;
  local_970 = local_eb0;
  uStack_968 = uStack_ea8;
  local_980 = local_ed0;
  uStack_978 = uStack_ec8;
  auVar18._16_8_ = uVar13;
  auVar18._0_16_ = auVar4;
  auVar18._24_8_ = uVar14;
  local_e80 = vperm2i128_avx2(auVar18,auVar8,0x21);
  auVar6._16_8_ = uVar15;
  auVar6._0_16_ = auVar49;
  auVar6._24_8_ = uVar16;
  local_ea0 = vperm2i128_avx2(auVar7,auVar6,0x21);
  btf_16_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,
              in_stack_ffffffffffffe618,in_stack_ffffffffffffe610,in_stack_ffffffffffffe608,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_990 = local_eb0;
  uStack_988 = uStack_ea8;
  local_9a0 = local_ed0;
  uStack_998 = uStack_ec8;
  local_1620 = auVar9._0_8_;
  uStack_1618 = auVar9._8_8_;
  uStack_1610 = auVar9._16_8_;
  uStack_1608 = auVar9._24_8_;
  local_4c0 = local_1620;
  uStack_4b8 = uStack_1618;
  uStack_4b0 = uStack_1610;
  uStack_4a8 = uStack_1608;
  local_4e0 = uVar56;
  uStack_4d8 = uVar57;
  uStack_4d0 = uVar54;
  uStack_4c8 = uVar55;
  auVar30._8_8_ = uVar57;
  auVar30._0_8_ = uVar56;
  auVar30._16_8_ = uVar54;
  auVar30._24_8_ = uVar55;
  auVar5 = vpaddsw_avx2(auVar9,auVar30);
  local_160 = local_1620;
  uStack_158 = uStack_1618;
  uStack_150 = uStack_1610;
  uStack_148 = uStack_1608;
  local_180 = uVar56;
  uStack_178 = uVar57;
  uStack_170 = uVar54;
  uStack_168 = uVar55;
  auVar44._8_8_ = uVar57;
  auVar44._0_8_ = uVar56;
  auVar44._16_8_ = uVar54;
  auVar44._24_8_ = uVar55;
  auVar9 = vpsubsw_avx2(auVar9,auVar44);
  local_15c0 = auVar10._0_8_;
  uStack_15b8 = auVar10._8_8_;
  uStack_15b0 = auVar10._16_8_;
  uStack_15a8 = auVar10._24_8_;
  local_500 = local_15c0;
  uStack_4f8 = uStack_15b8;
  uStack_4f0 = uStack_15b0;
  uStack_4e8 = uStack_15a8;
  local_520 = uVar52;
  uStack_518 = uVar53;
  lStack_510 = lVar50;
  lStack_508 = lVar51;
  auVar29._8_8_ = uVar53;
  auVar29._0_8_ = uVar52;
  auVar29._16_8_ = lVar50;
  auVar29._24_8_ = lVar51;
  auVar6 = vpaddsw_avx2(auVar10,auVar29);
  local_1a0 = local_15c0;
  uStack_198 = uStack_15b8;
  uStack_190 = uStack_15b0;
  uStack_188 = uStack_15a8;
  local_1c0 = uVar52;
  uStack_1b8 = uVar53;
  lStack_1b0 = lVar50;
  lStack_1a8 = lVar51;
  auVar43._8_8_ = uVar53;
  auVar43._0_8_ = uVar52;
  auVar43._16_8_ = lVar50;
  auVar43._24_8_ = lVar51;
  auVar10 = vpsubsw_avx2(auVar10,auVar43);
  local_15a0 = auVar11._0_8_;
  uStack_1598 = auVar11._8_8_;
  uStack_1590 = auVar11._16_8_;
  uStack_1588 = auVar11._24_8_;
  local_540 = local_15a0;
  uStack_538 = uStack_1598;
  uStack_530 = uStack_1590;
  uStack_528 = uStack_1588;
  local_560 = local_eb0;
  uStack_558 = uStack_ea8;
  uStack_550 = local_ec0;
  uStack_548 = uStack_eb8;
  auVar28._8_8_ = uStack_ea8;
  auVar28._0_8_ = local_eb0;
  auVar28._16_8_ = local_ec0;
  auVar28._24_8_ = uStack_eb8;
  auVar7 = vpaddsw_avx2(auVar11,auVar28);
  local_1e0 = local_15a0;
  uStack_1d8 = uStack_1598;
  uStack_1d0 = uStack_1590;
  uStack_1c8 = uStack_1588;
  local_200 = local_eb0;
  uStack_1f8 = uStack_ea8;
  uStack_1f0 = local_ec0;
  uStack_1e8 = uStack_eb8;
  auVar42._8_8_ = uStack_ea8;
  auVar42._0_8_ = local_eb0;
  auVar42._16_8_ = local_ec0;
  auVar42._24_8_ = uStack_eb8;
  auVar11 = vpsubsw_avx2(auVar11,auVar42);
  local_1540 = auVar12._0_8_;
  uStack_1538 = auVar12._8_8_;
  uStack_1530 = auVar12._16_8_;
  uStack_1528 = auVar12._24_8_;
  local_580 = local_1540;
  uStack_578 = uStack_1538;
  uStack_570 = uStack_1530;
  uStack_568 = uStack_1528;
  local_5a0 = local_ed0;
  uStack_598 = uStack_ec8;
  lStack_590 = local_ee0;
  lStack_588 = lStack_ed8;
  auVar27._8_8_ = uStack_ec8;
  auVar27._0_8_ = local_ed0;
  auVar27._16_8_ = local_ee0;
  auVar27._24_8_ = lStack_ed8;
  auVar8 = vpaddsw_avx2(auVar12,auVar27);
  local_220 = local_1540;
  uStack_218 = uStack_1538;
  uStack_210 = uStack_1530;
  uStack_208 = uStack_1528;
  local_240 = local_ed0;
  uStack_238 = uStack_ec8;
  lStack_230 = local_ee0;
  lStack_228 = lStack_ed8;
  auVar41._8_8_ = uStack_ec8;
  auVar41._0_8_ = local_ed0;
  auVar41._16_8_ = local_ee0;
  auVar41._24_8_ = lStack_ed8;
  auVar12 = vpsubsw_avx2(auVar12,auVar41);
  local_1720 = auVar5._0_8_;
  uStack_1718 = auVar5._8_8_;
  uStack_1710 = auVar5._16_8_;
  uStack_1708 = auVar5._24_8_;
  local_1700 = auVar9._0_8_;
  uStack_16f8 = auVar9._8_8_;
  uStack_16f0 = auVar9._16_8_;
  uStack_16e8 = auVar9._24_8_;
  local_16a0 = auVar7._0_8_;
  uStack_1698 = auVar7._8_8_;
  uStack_1690 = auVar7._16_8_;
  uStack_1688 = auVar7._24_8_;
  local_1680 = auVar11._0_8_;
  uStack_1678 = auVar11._8_8_;
  uStack_1670 = auVar11._16_8_;
  uStack_1668 = auVar11._24_8_;
  local_e80 = vperm2i128_avx2(auVar6,auVar10,0x20);
  local_ea0 = vperm2i128_avx2(auVar6,auVar10,0x31);
  btf_16_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,
              in_stack_ffffffffffffe618,in_stack_ffffffffffffe610,in_stack_ffffffffffffe608,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  uVar53 = uStack_ea8;
  uVar52 = local_eb0;
  uVar16 = uStack_eb8;
  uVar15 = local_ec0;
  uVar14 = uStack_ec8;
  uVar13 = local_ed0;
  lVar51 = lStack_ed8;
  lVar50 = local_ee0;
  local_9b0 = local_eb0;
  uStack_9a8 = uStack_ea8;
  local_9c0 = local_ed0;
  uStack_9b8 = uStack_ec8;
  local_e80 = vperm2i128_avx2(auVar8,auVar12,0x20);
  local_ea0 = vperm2i128_avx2(auVar8,auVar12,0x31);
  btf_16_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,
              in_stack_ffffffffffffe618,in_stack_ffffffffffffe610,in_stack_ffffffffffffe608,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_9d0 = local_eb0;
  uStack_9c8 = uStack_ea8;
  local_9e0 = local_ed0;
  uStack_9d8 = uStack_ec8;
  local_5c0 = local_1720;
  uStack_5b8 = uStack_1718;
  uStack_5b0 = uStack_1710;
  uStack_5a8 = uStack_1708;
  local_5e0 = uVar52;
  uStack_5d8 = uVar53;
  uStack_5d0 = uVar15;
  uStack_5c8 = uVar16;
  auVar26._8_8_ = uVar53;
  auVar26._0_8_ = uVar52;
  auVar26._16_8_ = uVar15;
  auVar26._24_8_ = uVar16;
  auVar6 = vpaddsw_avx2(auVar5,auVar26);
  local_260 = local_1720;
  uStack_258 = uStack_1718;
  uStack_250 = uStack_1710;
  uStack_248 = uStack_1708;
  local_280 = uVar52;
  uStack_278 = uVar53;
  uStack_270 = uVar15;
  uStack_268 = uVar16;
  auVar40._8_8_ = uVar53;
  auVar40._0_8_ = uVar52;
  auVar40._16_8_ = uVar15;
  auVar40._24_8_ = uVar16;
  auVar10 = vpsubsw_avx2(auVar5,auVar40);
  local_600 = local_1700;
  uStack_5f8 = uStack_16f8;
  uStack_5f0 = uStack_16f0;
  uStack_5e8 = uStack_16e8;
  local_620 = uVar13;
  uStack_618 = uVar14;
  lStack_610 = lVar50;
  lStack_608 = lVar51;
  auVar25._8_8_ = uVar14;
  auVar25._0_8_ = uVar13;
  auVar25._16_8_ = lVar50;
  auVar25._24_8_ = lVar51;
  auVar5 = vpaddsw_avx2(auVar9,auVar25);
  local_2a0 = local_1700;
  uStack_298 = uStack_16f8;
  uStack_290 = uStack_16f0;
  uStack_288 = uStack_16e8;
  local_2c0 = uVar13;
  uStack_2b8 = uVar14;
  lStack_2b0 = lVar50;
  lStack_2a8 = lVar51;
  auVar39._8_8_ = uVar14;
  auVar39._0_8_ = uVar13;
  auVar39._16_8_ = lVar50;
  auVar39._24_8_ = lVar51;
  auVar9 = vpsubsw_avx2(auVar9,auVar39);
  local_640 = local_16a0;
  uStack_638 = uStack_1698;
  uStack_630 = uStack_1690;
  uStack_628 = uStack_1688;
  local_660 = local_eb0;
  uStack_658 = uStack_ea8;
  uStack_650 = local_ec0;
  uStack_648 = uStack_eb8;
  auVar24._8_8_ = uStack_ea8;
  auVar24._0_8_ = local_eb0;
  auVar24._16_8_ = local_ec0;
  auVar24._24_8_ = uStack_eb8;
  auVar8 = vpaddsw_avx2(auVar7,auVar24);
  local_2e0 = local_16a0;
  uStack_2d8 = uStack_1698;
  uStack_2d0 = uStack_1690;
  uStack_2c8 = uStack_1688;
  local_300 = local_eb0;
  uStack_2f8 = uStack_ea8;
  uStack_2f0 = local_ec0;
  uStack_2e8 = uStack_eb8;
  auVar38._8_8_ = uStack_ea8;
  auVar38._0_8_ = local_eb0;
  auVar38._16_8_ = local_ec0;
  auVar38._24_8_ = uStack_eb8;
  auVar12 = vpsubsw_avx2(auVar7,auVar38);
  local_680 = local_1680;
  uStack_678 = uStack_1678;
  uStack_670 = uStack_1670;
  uStack_668 = uStack_1668;
  local_6a0 = local_ed0;
  uStack_698 = uStack_ec8;
  lStack_690 = local_ee0;
  lStack_688 = lStack_ed8;
  auVar23._8_8_ = uStack_ec8;
  auVar23._0_8_ = local_ed0;
  auVar23._16_8_ = local_ee0;
  auVar23._24_8_ = lStack_ed8;
  auVar7 = vpaddsw_avx2(auVar11,auVar23);
  local_320 = local_1680;
  uStack_318 = uStack_1678;
  uStack_310 = uStack_1670;
  uStack_308 = uStack_1668;
  local_340 = local_ed0;
  uStack_338 = uStack_ec8;
  lStack_330 = local_ee0;
  lStack_328 = lStack_ed8;
  auVar37._8_8_ = uStack_ec8;
  auVar37._0_8_ = local_ed0;
  auVar37._16_8_ = local_ee0;
  auVar37._24_8_ = lStack_ed8;
  auVar11 = vpsubsw_avx2(auVar11,auVar37);
  local_1920 = auVar6._0_8_;
  uStack_1918 = auVar6._8_8_;
  uStack_1910 = auVar6._16_8_;
  uStack_1908 = auVar6._24_8_;
  local_18e0 = auVar5._0_8_;
  palStack_18d8 = auVar5._8_8_;
  palStack_18d0 = auVar5._16_8_;
  palStack_18c8 = auVar5._24_8_;
  local_1900 = auVar10._0_8_;
  palStack_18f8 = auVar10._8_8_;
  palStack_18f0 = auVar10._16_8_;
  uStack_18e8 = auVar10._24_8_;
  local_18c0 = auVar9._0_8_;
  uStack_18b8 = auVar9._8_8_;
  uStack_18b0 = auVar9._16_8_;
  uStack_18a8 = auVar9._24_8_;
  local_e80 = vperm2i128_avx2(auVar8,auVar7,0x20);
  local_ea0 = vperm2i128_avx2(auVar8,auVar7,0x31);
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  uVar53 = uStack_ea8;
  uVar52 = local_eb0;
  uVar16 = uStack_eb8;
  uVar15 = local_ec0;
  uVar14 = uStack_ec8;
  uVar13 = local_ed0;
  lVar51 = lStack_ed8;
  lVar50 = local_ee0;
  local_9f0 = local_eb0;
  uStack_9e8 = uStack_ea8;
  local_a00 = local_ed0;
  uStack_9f8 = uStack_ec8;
  local_e80 = vperm2i128_avx2(auVar12,auVar11,0x20);
  local_ea0 = vperm2i128_avx2(auVar12,auVar11,0x31);
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)&local_ee0,(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_a10 = local_eb0;
  uStack_a08 = uStack_ea8;
  local_a20 = local_ed0;
  uStack_a18 = uStack_ec8;
  local_6c0 = local_1920;
  uStack_6b8 = uStack_1918;
  uStack_6b0 = uStack_1910;
  uStack_6a8 = uStack_1908;
  local_6e0 = uVar52;
  uStack_6d8 = uVar53;
  uStack_6d0 = uVar15;
  uStack_6c8 = uVar16;
  auVar22._8_8_ = uVar53;
  auVar22._0_8_ = uVar52;
  auVar22._16_8_ = uVar15;
  auVar22._24_8_ = uVar16;
  auVar5 = vpaddsw_avx2(auVar6,auVar22);
  local_360 = local_1920;
  uStack_358 = uStack_1918;
  uStack_350 = uStack_1910;
  uStack_348 = uStack_1908;
  local_380 = uVar52;
  uStack_378 = uVar53;
  uStack_370 = uVar15;
  uStack_368 = uVar16;
  auVar36._8_8_ = uVar53;
  auVar36._0_8_ = uVar52;
  auVar36._16_8_ = uVar15;
  auVar36._24_8_ = uVar16;
  auVar10 = vpsubsw_avx2(auVar6,auVar36);
  local_700 = local_18e0;
  local_720 = uVar13;
  uStack_718 = uVar14;
  lStack_710 = lVar50;
  lStack_708 = lVar51;
  auVar21._8_8_ = palStack_18d8;
  auVar21._0_8_ = local_18e0;
  auVar21._16_8_ = palStack_18d0;
  auVar21._24_8_ = palStack_18c8;
  auVar20._8_8_ = uVar14;
  auVar20._0_8_ = uVar13;
  auVar20._16_8_ = lVar50;
  auVar20._24_8_ = lVar51;
  auVar6 = vpaddsw_avx2(auVar21,auVar20);
  local_3a0 = local_18e0;
  local_3c0 = uVar13;
  uStack_3b8 = uVar14;
  lStack_3b0 = lVar50;
  lStack_3a8 = lVar51;
  auVar35._8_8_ = palStack_18d8;
  auVar35._0_8_ = local_18e0;
  auVar35._16_8_ = palStack_18d0;
  auVar35._24_8_ = palStack_18c8;
  auVar34._8_8_ = uVar14;
  auVar34._0_8_ = uVar13;
  auVar34._16_8_ = lVar50;
  auVar34._24_8_ = lVar51;
  auVar11 = vpsubsw_avx2(auVar35,auVar34);
  uStack_728 = uStack_18e8;
  local_760 = local_eb0;
  uStack_758 = uStack_ea8;
  uStack_750 = local_ec0;
  uStack_748 = uStack_eb8;
  auVar19._8_8_ = palStack_18f8;
  auVar19._0_8_ = local_1900;
  auVar19._16_8_ = palStack_18f0;
  auVar19._24_8_ = uStack_18e8;
  auVar7._8_8_ = uStack_ea8;
  auVar7._0_8_ = local_eb0;
  auVar7._16_8_ = local_ec0;
  auVar7._24_8_ = uStack_eb8;
  auVar7 = vpaddsw_avx2(auVar19,auVar7);
  uStack_3c8 = uStack_18e8;
  local_400 = local_eb0;
  uStack_3f8 = uStack_ea8;
  uStack_3f0 = local_ec0;
  uStack_3e8 = uStack_eb8;
  auVar33._8_8_ = palStack_18f8;
  auVar33._0_8_ = local_1900;
  auVar33._16_8_ = palStack_18f0;
  auVar33._24_8_ = uStack_18e8;
  auVar32._8_8_ = uStack_ea8;
  auVar32._0_8_ = local_eb0;
  auVar32._16_8_ = local_ec0;
  auVar32._24_8_ = uStack_eb8;
  auVar12 = vpsubsw_avx2(auVar33,auVar32);
  local_780 = local_18c0;
  uStack_778 = uStack_18b8;
  uStack_770 = uStack_18b0;
  uStack_768 = uStack_18a8;
  local_7a0 = local_ed0;
  uStack_798 = uStack_ec8;
  lStack_790 = local_ee0;
  lStack_788 = lStack_ed8;
  auVar8._8_8_ = uStack_ec8;
  auVar8._0_8_ = local_ed0;
  auVar8._16_8_ = local_ee0;
  auVar8._24_8_ = lStack_ed8;
  auVar8 = vpaddsw_avx2(auVar9,auVar8);
  local_420 = local_18c0;
  uStack_418 = uStack_18b8;
  uStack_410 = uStack_18b0;
  uStack_408 = uStack_18a8;
  local_440 = local_ed0;
  uStack_438 = uStack_ec8;
  lStack_430 = local_ee0;
  lStack_428 = lStack_ed8;
  auVar31._8_8_ = uStack_ec8;
  auVar31._0_8_ = local_ed0;
  auVar31._16_8_ = local_ee0;
  auVar31._24_8_ = lStack_ed8;
  auVar9 = vpsubsw_avx2(auVar9,auVar31);
  local_e80 = vperm2i128_avx2(auVar5,auVar6,0x20);
  local_ea0 = vperm2i128_avx2(auVar5,auVar6,0x31);
  local_740 = local_1900;
  palStack_738 = palStack_18f8;
  palStack_730 = palStack_18f0;
  palStack_6f8 = palStack_18d8;
  palStack_6f0 = palStack_18d0;
  palStack_6e8 = palStack_18c8;
  local_3e0 = local_1900;
  palStack_3d8 = palStack_18f8;
  palStack_3d0 = palStack_18f0;
  palStack_398 = palStack_18d8;
  palStack_390 = palStack_18d0;
  palStack_388 = palStack_18c8;
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)(local_e00 + 0x20),(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_e80 = vperm2i128_avx2(auVar7,auVar8,0x20);
  local_ea0 = vperm2i128_avx2(auVar7,auVar8,0x31);
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)(local_e00 + 0x60),(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_e80 = vperm2i128_avx2(auVar10,auVar11,0x20);
  local_ea0 = vperm2i128_avx2(auVar10,auVar11,0x31);
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)(local_e00 + 0xa0),(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  local_e80 = vperm2i128_avx2(auVar12,auVar9,0x20);
  local_ea0 = vperm2i128_avx2(auVar12,auVar9,0x31);
  btf_16_avx2(palStack_18f0,palStack_18f8,local_1900,palStack_18c8,palStack_18d0,palStack_18d8,
              (__m128i *)(local_e00 + 0xe0),(__m128i *)&local_e60,(__m256i *)&local_e01,
              in_stack_ffffffffffffe420);
  return;
}

Assistant:

static inline void fadst8x16_new_avx2(const __m128i *input, __m128i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i in0, in1;
  __m128i temp0, temp1, temp2, temp3;

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  __m256i cospi_arr[20];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                         cospi_p40_p24, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_m08),
                                         cospi_p24_m40, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m56_p08),
                                          cospi_m24_p40, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                          cospi_p40_p24, 0x1);
  cospi_arr[12] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p02_p62),
                                          cospi_p10_p54, 0x1);
  cospi_arr[13] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p62_m02),
                                          cospi_p54_m10, 0x1);
  cospi_arr[14] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p18_p46),
                                          cospi_p26_p38, 0x1);
  cospi_arr[15] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p46_m18),
                                          cospi_p38_m26, 0x1);
  cospi_arr[16] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p34_p30),
                                          cospi_p42_p22, 0x1);
  cospi_arr[17] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p30_m34),
                                          cospi_p22_m42, 0x1);
  cospi_arr[18] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p50_p14),
                                          cospi_p58_p06, 0x1);
  cospi_arr[19] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p14_m50),
                                          cospi_p06_m58, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[4], 0x1);
  x[1] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[6], 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[12], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[14],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[1]), input[9], 0x1);
  x[5] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[3]), input[11], 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[13], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[15], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = x[0];
  x1[1] = _mm256_subs_epi16(__zero, x[7]);
  x1[2] = x[2];
  x1[3] = _mm256_subs_epi16(__zero, x[5]);
  x1[4] = _mm256_subs_epi16(__zero, x[4]);
  x1[5] = x[3];
  x1[6] = _mm256_subs_epi16(__zero, x[6]);
  x1[7] = x[1];

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_blend_epi32(x1[0], x1[1], 0xf0);
  x2[3] = _mm256_blend_epi32(x1[3], x1[2], 0xf0);
  x2[4] = _mm256_blend_epi32(x1[4], x1[5], 0xf0);
  x2[7] = _mm256_blend_epi32(x1[7], x1[6], 0xf0);
  in0 = _mm256_blend_epi32(x1[1], x1[0], 0xf0);
  in1 = _mm256_blend_epi32(x1[2], x1[3], 0xf0);
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x1[7], x1[6], 0x21);
  in1 = _mm256_permute2f128_si256(x1[4], x1[5], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_adds_epi16(x2[3], x2[2]);
  x3[3] = _mm256_subs_epi16(x2[3], x2[2]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm256_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm256_adds_epi16(x2[7], x2[6]);
  x3[7] = _mm256_subs_epi16(x2[7], x2[6]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[4] = x3[4];
  x4[5] = x3[5];
  in0 = _mm256_permute2f128_si256(x3[2], x3[3], 0x20);
  in1 = _mm256_permute2f128_si256(x3[2], x3[3], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x3[6], x3[7], 0x20);
  in1 = _mm256_permute2f128_si256(x3[6], x3[7], 0x31);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[2]);
  x5[1] = _mm256_subs_epi16(x4[0], x4[2]);
  x5[2] = _mm256_adds_epi16(x4[1], x4[3]);
  x5[3] = _mm256_subs_epi16(x4[1], x4[3]);
  x5[4] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[5] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[6] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  __m256i x6[8];
  x6[0] = x5[0];
  x6[1] = x5[2];
  x6[2] = x5[1];
  x6[3] = x5[3];
  in0 = _mm256_permute2f128_si256(x5[4], x5[6], 0x20);
  in1 = _mm256_permute2f128_si256(x5[4], x5[6], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x6[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x5[5], x5[7], 0x20);
  in1 = _mm256_permute2f128_si256(x5[5], x5[7], 0x31);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x6[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 7
  __m256i x7[8];
  x7[0] = _mm256_adds_epi16(x6[0], x6[4]);
  x7[1] = _mm256_subs_epi16(x6[0], x6[4]);
  x7[2] = _mm256_adds_epi16(x6[1], x6[5]);
  x7[3] = _mm256_subs_epi16(x6[1], x6[5]);
  x7[4] = _mm256_adds_epi16(x6[2], x6[6]);
  x7[5] = _mm256_subs_epi16(x6[2], x6[6]);
  x7[6] = _mm256_adds_epi16(x6[3], x6[7]);
  x7[7] = _mm256_subs_epi16(x6[3], x6[7]);

  // stage 8
  in0 = _mm256_permute2f128_si256(x7[0], x7[2], 0x20);
  in1 = _mm256_permute2f128_si256(x7[0], x7[2], 0x31);
  btf_16_avx2(&cospi_arr[12], &cospi_arr[13], &in0, &in1, &output[15],
              &output[0], &output[13], &output[2], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[4], x7[6], 0x20);
  in1 = _mm256_permute2f128_si256(x7[4], x7[6], 0x31);
  btf_16_avx2(&cospi_arr[14], &cospi_arr[15], &in0, &in1, &output[11],
              &output[4], &output[9], &output[6], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[1], x7[3], 0x20);
  in1 = _mm256_permute2f128_si256(x7[1], x7[3], 0x31);
  btf_16_avx2(&cospi_arr[16], &cospi_arr[17], &in0, &in1, &output[7],
              &output[8], &output[5], &output[10], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[5], x7[7], 0x20);
  in1 = _mm256_permute2f128_si256(x7[5], x7[7], 0x31);
  btf_16_avx2(&cospi_arr[18], &cospi_arr[19], &in0, &in1, &output[3],
              &output[12], &output[1], &output[14], &__rounding_256, &cos_bit);
}